

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O0

DataHeader *
offsetTOCLookupFn(UDataMemory *pData,char *tocEntryName,int32_t *pLength,UErrorCode *pErrorCode)

{
  int count_00;
  int *names;
  int32_t iVar1;
  long lVar2;
  UDataOffsetTOCEntry *entry;
  int32_t count;
  int32_t number;
  char *base;
  UDataOffsetTOC *toc;
  UErrorCode *pErrorCode_local;
  int32_t *pLength_local;
  char *tocEntryName_local;
  UDataMemory *pData_local;
  
  names = (int *)pData->toc;
  if (names == (int *)0x0) {
    pData_local = (UDataMemory *)pData->pHeader;
  }
  else {
    count_00 = *names;
    iVar1 = offsetTOCPrefixBinarySearch
                      (tocEntryName,(char *)names,(UDataOffsetTOCEntry *)(names + 1),count_00);
    if (iVar1 < 0) {
      pData_local = (UDataMemory *)0x0;
    }
    else {
      lVar2 = (long)iVar1;
      if (iVar1 + 1 < count_00) {
        *pLength = names[lVar2 * 2 + 4] - names[lVar2 * 2 + 2];
      }
      else {
        *pLength = -1;
      }
      pData_local = (UDataMemory *)((long)names + (ulong)(uint)names[lVar2 * 2 + 2]);
    }
  }
  return (DataHeader *)pData_local;
}

Assistant:

static const DataHeader * U_CALLCONV
offsetTOCLookupFn(const UDataMemory *pData,
                  const char *tocEntryName,
                  int32_t *pLength,
                  UErrorCode *pErrorCode) {
    (void)pErrorCode;
    const UDataOffsetTOC  *toc = (UDataOffsetTOC *)pData->toc;
    if(toc!=NULL) {
        const char *base=(const char *)toc;
        int32_t number, count=(int32_t)toc->count;

        /* perform a binary search for the data in the common data's table of contents */
#if defined (UDATA_DEBUG_DUMP)
        /* list the contents of the TOC each time .. not recommended */
        for(number=0; number<count; ++number) {
            fprintf(stderr, "\tx%d: %s\n", number, &base[toc->entry[number].nameOffset]);
        }
#endif
        number=offsetTOCPrefixBinarySearch(tocEntryName, base, toc->entry, count);
        if(number>=0) {
            /* found it */
            const UDataOffsetTOCEntry *entry=toc->entry+number;
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Found.\n", tocEntryName);
#endif
            if((number+1) < count) {
                *pLength = (int32_t)(entry[1].dataOffset - entry->dataOffset);
            } else {
                *pLength = -1;
            }
            return (const DataHeader *)(base+entry->dataOffset);
        } else {
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Not found.\n", tocEntryName);
#endif
            return NULL;
        }
    } else {
#ifdef UDATA_DEBUG
        fprintf(stderr, "returning header\n");
#endif

        return pData->pHeader;
    }
}